

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSource(FileGenerator *this,Printer *printer)

{
  pointer ppSVar1;
  FileDescriptor *file;
  FileOptions_OptimizeMode FVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  Options *options;
  ulong uVar6;
  pointer ppSVar7;
  undefined1 local_1d0 [8];
  CrossFileReferences refs;
  size_type __dnew;
  Formatter format;
  NamespaceOpener ns;
  string local_50;
  
  __dnew = (size_type)printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  GenerateSourceIncludes(this,printer);
  local_1d0 = (undefined1  [8])&refs.strong_sccs._M_h._M_rehash_policy._M_next_resize;
  options = (Options *)0x1;
  refs.strong_sccs._M_h._M_buckets = (__buckets_ptr)0x1;
  refs.strong_sccs._M_h._M_bucket_count = 0;
  refs.strong_sccs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.strong_sccs._M_h._M_element_count._0_4_ = 0x3f800000;
  refs.strong_sccs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  refs.strong_sccs._M_h._M_rehash_policy._4_4_ = 0;
  refs.strong_sccs._M_h._M_rehash_policy._M_next_resize = 0;
  refs.strong_sccs._M_h._M_single_bucket =
       (__node_base_ptr)&refs.weak_sccs._M_h._M_rehash_policy._M_next_resize;
  refs.weak_sccs._M_h._M_buckets = (__buckets_ptr)0x1;
  refs.weak_sccs._M_h._M_bucket_count = 0;
  refs.weak_sccs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.weak_sccs._M_h._M_element_count._0_4_ = 0x3f800000;
  refs.weak_sccs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  refs.weak_sccs._M_h._M_rehash_policy._4_4_ = 0;
  refs.weak_sccs._M_h._M_rehash_policy._M_next_resize = 0;
  refs.weak_sccs._M_h._M_single_bucket =
       (__node_base_ptr)&refs.weak_default_instances._M_h._M_rehash_policy._M_next_resize;
  refs.weak_default_instances._M_h._M_buckets = (__buckets_ptr)0x1;
  refs.weak_default_instances._M_h._M_bucket_count = 0;
  refs.weak_default_instances._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.weak_default_instances._M_h._M_element_count._0_4_ = 0x3f800000;
  refs.weak_default_instances._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  refs.weak_default_instances._M_h._M_rehash_policy._4_4_ = 0;
  refs.weak_default_instances._M_h._M_rehash_policy._M_next_resize = 0;
  refs.weak_default_instances._M_h._M_single_bucket =
       (__node_base_ptr)&refs.strong_reflection_files._M_h._M_rehash_policy._M_next_resize;
  refs.strong_reflection_files._M_h._M_buckets = (__buckets_ptr)0x1;
  refs.strong_reflection_files._M_h._M_bucket_count = 0;
  refs.strong_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.strong_reflection_files._M_h._M_element_count._0_4_ = 0x3f800000;
  refs.strong_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  refs.strong_reflection_files._M_h._M_rehash_policy._4_4_ = 0;
  refs.strong_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  refs.strong_reflection_files._M_h._M_single_bucket =
       (__node_base_ptr)&refs.weak_reflection_files._M_h._M_rehash_policy._M_next_resize;
  refs.weak_reflection_files._M_h._M_buckets = (__buckets_ptr)0x1;
  refs.weak_reflection_files._M_h._M_bucket_count = 0;
  refs.weak_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.weak_reflection_files._M_h._M_element_count._0_4_ = 0x3f800000;
  refs.weak_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  refs.weak_reflection_files._M_h._M_rehash_policy._4_4_ = 0;
  refs.weak_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  GetCrossFileReferencesForFile(this,this->file_,(CrossFileReferences *)local_1d0);
  GenerateInternalForwardDeclarations(this,(CrossFileReferences *)local_1d0,printer);
  ns.name_stack_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &(this->options_).dllexport_decl;
  Namespace_abi_cxx11_
            (&local_50,(cpp *)this->file_,
             (FileDescriptor *)
             ns.name_stack_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,options);
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_50,(Formatter *)&__dnew);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      GenerateSourceDefaultInstance(this,(int)uVar6,printer);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  NamespaceOpener::~NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GenerateTables(this,printer);
  ppSVar7 = (this->sccs_).
            super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->sccs_).
            super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar7 != ppSVar1) {
    do {
      options = (Options *)printer;
      GenerateInitForSCC(this,*ppSVar7,(CrossFileReferences *)local_1d0,printer);
      ppSVar7 = ppSVar7 + 1;
    } while (ppSVar7 != ppSVar1);
  }
  FVar2 = GetOptimizeFor(this->file_,
                         (Options *)
                         ns.name_stack_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)0x0);
  if (FVar2 != FileOptions_OptimizeMode_LITE_RUNTIME) {
    GenerateReflectionInitializationCode(this,printer);
  }
  Namespace_abi_cxx11_
            (&local_50,(cpp *)this->file_,
             (FileDescriptor *)
             ns.name_stack_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,options);
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_50,(Formatter *)&__dnew);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  puVar3 = (this->enum_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
    uVar6 = 0;
    do {
      EnumGenerator::GenerateMethods
                (puVar3[uVar6]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false>.
                 _M_head_impl,(int)uVar6,printer);
      uVar6 = uVar6 + 1;
      puVar3 = (this->enum_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->enum_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3));
  }
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      Formatter::operator()<>((Formatter *)&__dnew,"\n");
      Formatter::operator()<>
                ((Formatter *)&__dnew,
                 "// ===================================================================\n");
      Formatter::operator()<>((Formatter *)&__dnew,"\n");
      MessageGenerator::GenerateClassMethods
                ((MessageGenerator *)
                 (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                 ._M_t,printer);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  file = this->file_;
  if (0 < *(int *)(file + 0x34)) {
    FVar2 = GetOptimizeFor(file,(Options *)
                                ns.name_stack_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)0x0);
    if (((FVar2 != FileOptions_OptimizeMode_LITE_RUNTIME) &&
        (*(char *)(*(long *)(file + 0x88) + 0x9b) == '\x01')) &&
       ((this->service_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->service_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      uVar6 = 0;
      do {
        if (uVar6 == 0) {
          Formatter::operator()<>((Formatter *)&__dnew,"\n");
        }
        Formatter::operator()<>
                  ((Formatter *)&__dnew,
                   "// ===================================================================\n");
        Formatter::operator()<>((Formatter *)&__dnew,"\n");
        ServiceGenerator::GenerateImplementation
                  ((ServiceGenerator *)
                   (this->service_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
                   ._M_t,printer);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)(this->service_generators_).
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->service_generators_).
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  puVar4 = (this->extension_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->extension_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar4) {
    uVar6 = 0;
    do {
      ExtensionGenerator::GenerateDefinition
                (puVar4[uVar6]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false>
                 ._M_head_impl,printer);
      uVar6 = uVar6 + 1;
      puVar4 = (this->extension_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->extension_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3));
  }
  Formatter::operator()<>((Formatter *)&__dnew,"\n// @@protoc_insertion_point(namespace_scope)\n");
  NamespaceOpener::~NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  refs.weak_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x15;
  local_50._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create
                          ((ulong *)&local_50,
                           (ulong)&refs.weak_reflection_files._M_h._M_single_bucket);
  local_50.field_2._M_allocated_capacity =
       (size_type)refs.weak_reflection_files._M_h._M_single_bucket;
  builtin_strncpy(local_50._M_dataplus._M_p,"PROTOBUF_NAMESPACE_ID",0x15);
  local_50._M_string_length = (size_type)refs.weak_reflection_files._M_h._M_single_bucket;
  local_50._M_dataplus._M_p[(long)refs.weak_reflection_files._M_h._M_single_bucket] = '\0';
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_50,(Formatter *)&__dnew);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  puVar5 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar5) {
    uVar6 = 0;
    do {
      MessageGenerator::GenerateSourceInProto2Namespace
                (puVar5[uVar6]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>.
                 _M_head_impl,printer);
      uVar6 = uVar6 + 1;
      puVar5 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3));
  }
  NamespaceOpener::~NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Formatter::operator()<>((Formatter *)&__dnew,"\n// @@protoc_insertion_point(global_scope)\n");
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&ns.name_stack_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "net/proto2/public/port_undef.inc","");
  DoIncludeFile(this,(string *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,false,
                printer);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count != &ns.name_stack_) {
    operator_delete((void *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&refs.strong_reflection_files._M_h._M_single_bucket);
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&refs.weak_default_instances._M_h._M_single_bucket);
  std::
  _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&refs.weak_sccs._M_h._M_single_bucket);
  std::
  _Hashtable<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::compiler::SCC_*>,_std::hash<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::compiler::SCC_*>,_std::hash<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&refs.strong_sccs._M_h._M_single_bucket);
  std::
  _Hashtable<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::compiler::SCC_*>,_std::hash<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::compiler::SCC_*>,_std::hash<const_google::protobuf::compiler::SCC_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&format);
  return;
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);
  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  GenerateInternalForwardDeclarations(refs, printer);

  {
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Define default instances
    for (int i = 0; i < message_generators_.size(); i++) {
      GenerateSourceDefaultInstance(i, printer);
    }
  }

  {
    GenerateTables(printer);

    // Now generate the InitDefaults for each SCC.
    for (auto scc : sccs_) {
      GenerateInitForSCC(scc, refs, printer);
    }

    if (HasDescriptorMethods(file_, options_)) {
      // Define the code to initialize reflection. This code uses a global
      // constructor to register reflection data with the runtime pre-main.
      GenerateReflectionInitializationCode(printer);
    }
  }

  {
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Actually implement the protos

    // Generate enums.
    for (int i = 0; i < enum_generators_.size(); i++) {
      enum_generators_[i]->GenerateMethods(i, printer);
    }

    // Generate classes.
    for (int i = 0; i < message_generators_.size(); i++) {
      format("\n");
      format(kThickSeparator);
      format("\n");
      message_generators_[i]->GenerateClassMethods(printer);
    }

    if (HasGenericServices(file_, options_)) {
      // Generate services.
      for (int i = 0; i < service_generators_.size(); i++) {
        if (i == 0) format("\n");
        format(kThickSeparator);
        format("\n");
        service_generators_[i]->GenerateImplementation(printer);
      }
    }

    // Define extensions.
    for (int i = 0; i < extension_generators_.size(); i++) {
      extension_generators_[i]->GenerateDefinition(printer);
    }

    format(
        "\n"
        "// @@protoc_insertion_point(namespace_scope)\n");
  }

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
    for (int i = 0; i < message_generators_.size(); i++) {
      message_generators_[i]->GenerateSourceInProto2Namespace(printer);
    }
  }

  format(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");

  IncludeFile("net/proto2/public/port_undef.inc", printer);
}